

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O2

void __thiscall
Eigen::PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
          (PermutationMatrix<_1,_1,int> *this,
          InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *other)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long local_18;
  
  local_18 = *(long *)(*(long *)other + 8);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<long>((Matrix<int,__1,_1,_0,__1,_1> *)this,&local_18);
  lVar1 = *(long *)this;
  uVar3 = 0;
  uVar2 = (ulong)*(uint *)(this + 8);
  if ((int)*(uint *)(this + 8) < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    *(int *)(lVar1 + (long)*(int *)(**(long **)other + uVar3 * 4) * 4) = (int)uVar3;
  }
  return;
}

Assistant:

PermutationMatrix(const InverseImpl<Other,PermutationStorage>& other)
      : m_indices(other.derived().nestedExpression().size())
    {
      eigen_internal_assert(m_indices.size() <= NumTraits<StorageIndex>::highest());
      StorageIndex end = StorageIndex(m_indices.size());
      for (StorageIndex i=0; i<end;++i)
        m_indices.coeffRef(other.derived().nestedExpression().indices().coeff(i)) = i;
    }